

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<int&,char_const(&)[30],unsigned_long&>
               (string *s,char *fmt,int *v,char (*args) [30],unsigned_long *args_1)

{
  long lVar1;
  ulong uVar2;
  int *in_RDX;
  string *in_RDI;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string local_270 [16];
  string *in_stack_fffffffffffffda0;
  char **in_stack_fffffffffffffda8;
  char **in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  unsigned_long *in_stack_fffffffffffffdc8;
  char (*in_stack_fffffffffffffdd0) [30];
  string local_228 [4];
  int in_stack_fffffffffffffddc;
  string *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  stringstream local_208 [16];
  undefined1 local_1f8 [16];
  char *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  LogLevel in_stack_fffffffffffffe34;
  string local_80 [32];
  undefined4 local_60;
  unsigned_long *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb8,0x2a);
  bVar3 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb8,0x73);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffffb8,100);
  uVar5 = lVar1 != -1;
  if ((bVar3 & 1) == 0) {
    if ((bool)uVar5) {
      uVar2 = std::__cxx11::string::find((char)&stack0xffffffffffffffb8,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)&stack0xffffffffffffffb8,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int&>(in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_80);
      std::__cxx11::string::~string(local_80);
    }
    else if ((bVar4 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe34,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                 in_stack_fffffffffffffe18);
      }
      std::__cxx11::string::c_str();
      formatOne<int&>(in_stack_fffffffffffffdb8,(int *)in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_270);
      std::__cxx11::string::~string(local_270);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_208);
      std::ostream::operator<<(local_1f8,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator+=(in_RDI,local_228);
      std::__cxx11::string::~string(local_228);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
      std::__cxx11::stringstream::~stringstream(local_208);
    }
    stringPrintfRecursive<char_const(&)[30],unsigned_long&>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (char (*) [30])
               CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(uVar5,in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffa8);
    local_60 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<char_const(&)[30],unsigned_long&>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
               in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    local_60 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}